

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::CIRS2ICRS(CESkyCoord *in_cirs,CESkyCoord *out_icrs,CEDate *date)

{
  long *in_RDX;
  long *in_RSI;
  CEDate *in_RDI;
  double date_00;
  CEAngle *this;
  double dVar1;
  double return_dec;
  double return_ra;
  double tdb2;
  double tdb1;
  double eo;
  double *in_stack_fffffffffffffea8;
  double *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffec0;
  CEDateType date_format;
  double in_stack_fffffffffffffec8;
  CEDate *this_00;
  undefined4 local_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [64];
  CEAngle local_b8 [2];
  undefined1 local_98 [64];
  CEAngle local_58;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  long *local_10;
  CEDate *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_28 = 0;
  local_30 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_38 = (**(code **)(*in_RDX + 0x28))();
  CEDate::UTC2TDB(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,(double *)0x163cfe);
  local_40 = 0;
  local_48 = 0;
  this_00 = local_8;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(this_00,in_stack_fffffffffffffec8,date_format);
  (*this_00->_vptr_CEDate[3])(&local_58,this_00,local_98);
  date_00 = CEAngle::operator_cast_to_double(&local_58);
  this = (CEAngle *)CppEphem::julian_date_J2000();
  CEDate::CEDate(this_00,date_00,(CEDateType)((ulong)this >> 0x20));
  (*local_8->_vptr_CEDate[4])(local_b8,local_8,local_f8);
  dVar1 = CEAngle::operator_cast_to_double(local_b8);
  iauAtic13(date_00,dVar1,local_28,local_30,&local_40,&local_48,local_20);
  CEAngle::~CEAngle((CEAngle *)0x163e18);
  CEDate::~CEDate((CEDate *)0x163e22);
  CEAngle::~CEAngle((CEAngle *)0x163e2f);
  CEDate::~CEDate((CEDate *)0x163e3c);
  CEAngle::CEAngle(this,(double *)local_8);
  CEAngle::CEAngle(this,(double *)local_8);
  local_11c = 1;
  (**(code **)(*local_10 + 0x28))(local_10,local_108,local_118,&local_11c);
  CEAngle::~CEAngle((CEAngle *)0x163e9e);
  CEAngle::~CEAngle((CEAngle *)0x163ea8);
  return;
}

Assistant:

void CESkyCoord::CIRS2ICRS(const CESkyCoord& in_cirs, 
                           CESkyCoord*       out_icrs,
                           const CEDate&     date)
{
    double eo; // Equation of the origins

    // Compute the TDB date
    double tdb1(0.0);
    double tdb2(0.0);
    CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);

    // Use the SOFA library to compute the new date
    double return_ra(0.0);
    double return_dec(0.0);
    iauAtic13(in_cirs.XCoord(), in_cirs.YCoord(), 
              tdb1, tdb2, 
              &return_ra, &return_dec, &eo);

    // Subtract the eo from RA if J2000 coordinates are desired
    //*return_ra -= eo;

    out_icrs->SetCoordinates(CEAngle(return_ra), CEAngle(return_dec),
                             CESkyCoordType::ICRS);
    return;
}